

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

bool __thiscall anon_unknown.dwarf_5450::TlbExportVisitor::visit_(TlbExportVisitor *this,Enum *type)

{
  long lVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  undefined1 auVar4 [16];
  Indent indenter;
  undefined1 local_80 [40];
  Enum *local_58;
  string local_50;
  
  lVar1 = Typelib::Enum::values_abi_cxx11_();
  poVar2 = this->m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<enum name=\"",0xc);
  Typelib::Type::getName_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_80._0_8_,local_80._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_
            (&local_50,(this->m_source_id)._M_dataplus._M_p);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,">\n",2);
  local_58 = type;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((string *)local_80._0_8_ != (string *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_);
  }
  Indent::Indent((Indent *)local_80,&this->m_indent);
  for (p_Var3 = *(_Rb_tree_node_base **)(lVar1 + 0x18); p_Var3 != (_Rb_tree_node_base *)(lVar1 + 8);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                        (this->m_indent)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<value symbol=\"",0xf);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" value=\"",9);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,p_Var3[2]._M_color);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"/>\n",4);
  }
  Indent::~Indent((Indent *)local_80);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  auVar4 = Typelib::Type::getMetaData();
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_
            ((string *)local_80,auVar4._0_8_,auVar4._8_8_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_80._0_8_,local_80._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((string *)local_80._0_8_ != (string *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</enum>",7);
  return true;
}

Assistant:

bool TlbExportVisitor::visit_ (Enum const& type)
    {
        Enum::ValueMap const& values = type.values();
        m_stream << "<enum name=\"" << type.getName() << "\" " << emitSourceID() << ">\n";
        { Indent indenter(m_indent);
            Enum::ValueMap::const_iterator it;
            for (it = values.begin(); it != values.end(); ++it)
                m_stream << m_indent << "<value symbol=\"" << it->first << "\" value=\"" << it->second << "\"/>\n";
        }
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</enum>";

        return true;
    }